

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcVector.h
# Opt level: O1

void __thiscall
o3dgc::Vector<unsigned_char>::Allocate(Vector<unsigned_char> *this,unsigned_long size)

{
  uchar *__src;
  uchar *__dest;
  
  if (this->m_allocated < size) {
    this->m_allocated = size;
    __dest = (uchar *)operator_new__(size);
    if (this->m_size != 0) {
      __src = this->m_buffer;
      memcpy(__dest,__src,this->m_size);
      if (__src != (uchar *)0x0) {
        operator_delete__(__src);
      }
    }
    this->m_buffer = __dest;
  }
  return;
}

Assistant:

void                    Allocate(unsigned long size)
                                {
                                    if (size > m_allocated)
                                    {
                                        m_allocated = size;
                                        T * tmp     = new T [m_allocated];
                                        if (m_size > 0)
                                        {
                                            memcpy(tmp, m_buffer, m_size * sizeof(T) );
                                            delete [] m_buffer;
                                        }
                                        m_buffer = tmp;
                                    }
                                }